

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O1

void __thiscall FMD3Model::LoadGeometry(FMD3Model *this)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  MD3Triangle *pMVar9;
  MD3TexCoord *pMVar10;
  MD3Vertex *pMVar11;
  long lVar12;
  int j;
  long lVar13;
  MD3Surface *pMVar14;
  char *pcVar15;
  float *pfVar16;
  char *pcVar17;
  FResourceFile **ppFVar18;
  FMemLump lumpdata;
  undefined1 local_88 [32];
  FResourceFile **local_68;
  DWORD *local_60;
  DWORD *local_58;
  DWORD *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  FWadCollection::ReadLump((FWadCollection *)local_88,0xa861c0);
  local_88._24_8_ = SEXT48(this->numSurfaces);
  if (0 < (long)local_88._24_8_) {
    ppFVar18 = (FResourceFile **)0x0;
    if (*(int *)(local_88._0_8_ + -0xc) == 0) {
      local_88._0_8_ = ppFVar18;
    }
    pcVar15 = (char *)(local_88._0_8_ + (ulong)*(uint *)(local_88._0_8_ + 100));
    local_88._16_8_ = this->surfaces;
    local_88._12_4_ = this->numFrames;
    do {
      uVar6 = local_88._16_8_;
      uVar1 = *(uint *)(pcVar15 + 0x58);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)((MD3Surface *)(local_88._16_8_ + ppFVar18 * 0x38))->numTriangles;
      uVar8 = SUB168(auVar3 * ZEXT816(0xc),0);
      local_60 = (DWORD *)(ulong)*(uint *)(pcVar15 + 0x68);
      if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      pMVar9 = (MD3Triangle *)operator_new__(uVar8);
      pMVar14 = (MD3Surface *)(uVar6 + ppFVar18 * 0x38);
      pMVar14->tris = pMVar9;
      if (0 < pMVar14->numTriangles) {
        pcVar17 = pcVar15 + uVar1;
        lVar12 = 0;
        do {
          lVar13 = 0;
          do {
            pMVar9->VertIndex[lVar13] = *(int *)(pcVar17 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          lVar12 = lVar12 + 1;
          pMVar9 = pMVar9 + 1;
          pcVar17 = pcVar17 + 0xc;
        } while (lVar12 < pMVar14->numTriangles);
      }
      uVar1 = *(uint *)(pcVar15 + 0x60);
      uVar8 = (long)pMVar14->numVertices * 8;
      if ((long)pMVar14->numVertices < 0) {
        uVar8 = 0xffffffffffffffff;
      }
      pMVar10 = (MD3TexCoord *)operator_new__(uVar8);
      uVar5 = local_88._12_4_;
      pMVar14->texcoords = pMVar10;
      iVar2 = pMVar14->numVertices;
      if (0 < (long)iVar2) {
        lVar12 = 0;
        do {
          pMVar10[lVar12].s = *(float *)(pcVar15 + lVar12 * 8 + (ulong)uVar1);
          pMVar10[lVar12].t = *(float *)(pcVar15 + lVar12 * 8 + (ulong)uVar1 + 4);
          lVar12 = lVar12 + 1;
        } while (iVar2 != lVar12);
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)(iVar2 * local_88._12_4_);
      uVar8 = SUB168(auVar4 * ZEXT816(0x18),0);
      uVar1 = *(uint *)(pcVar15 + 100);
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      local_68 = ppFVar18;
      pMVar11 = (MD3Vertex *)operator_new__(uVar8);
      pMVar14->vertices = pMVar11;
      uVar7 = pMVar14->numVertices * uVar5;
      if (0 < (int)uVar7) {
        pfVar16 = &pMVar11->nz;
        uVar8 = 0;
        do {
          ((MD3Vertex *)(pfVar16 + -5))->x =
               (float)(int)*(short *)(pcVar15 + uVar8 * 8 + (ulong)uVar1) * 0.015625;
          pfVar16[-4] = (float)(int)*(short *)(pcVar15 + uVar8 * 8 + (ulong)uVar1 + 2) * 0.015625;
          pfVar16[-3] = (float)(int)*(short *)(pcVar15 + uVar8 * 8 + (ulong)uVar1 + 4) * 0.015625;
          local_58 = (DWORD *)((double)(byte)*(ushort *)(pcVar15 + uVar8 * 8 + (ulong)uVar1 + 6) *
                              0.02454369260617026);
          sincos((double)(*(ushort *)(pcVar15 + uVar8 * 8 + (ulong)uVar1 + 6) >> 8) *
                 0.02454369260617026,&local_38,&local_40);
          sincos((double)local_58,&local_48,(double *)&local_50);
          pfVar16[-2] = (float)(local_40 * local_48);
          pfVar16[-1] = (float)(local_48 * local_38);
          *pfVar16 = (float)(double)local_50;
          uVar8 = uVar8 + 1;
          pfVar16 = pfVar16 + 6;
        } while (uVar7 != uVar8);
      }
      pcVar15 = pcVar15 + (long)local_60;
      ppFVar18 = (FResourceFile **)((long)local_68 + 1);
    } while (ppFVar18 != (FResourceFile **)local_88._24_8_);
  }
  FMemLump::~FMemLump((FMemLump *)local_88);
  return;
}

Assistant:

void FMD3Model::LoadGeometry()
{
	FMemLump lumpdata = Wads.ReadLump(mLumpNum);
	const char *buffer = (const char *)lumpdata.GetMem();
	md3_header_t * hdr = (md3_header_t *)buffer;
	md3_surface_t * surf = (md3_surface_t*)(buffer + LittleLong(hdr->Ofs_Surfaces));

	for(int i=0;i<numSurfaces;i++)
	{
		MD3Surface * s = &surfaces[i];
		md3_surface_t * ss = surf;

		surf = (md3_surface_t *)(((char*)surf) + LittleLong(surf->Ofs_End));

		// copy triangle indices
		md3_triangle_t * tris = (md3_triangle_t*)(((char*)ss)+LittleLong(ss->Ofs_Triangles));
		s->tris = new MD3Triangle[s->numTriangles];

		for(int i=0;i<s->numTriangles;i++) for (int j=0;j<3;j++)
		{
			s->tris[i].VertIndex[j]=LittleLong(tris[i].vt_index[j]);
		}

		// Load texture coordinates
		md3_texcoord_t * tc = (md3_texcoord_t*)(((char*)ss)+LittleLong(ss->Ofs_Texcoord));
		s->texcoords = new MD3TexCoord[s->numVertices];

		for(int i=0;i<s->numVertices;i++)
		{
			s->texcoords[i].s = tc[i].s;
			s->texcoords[i].t = tc[i].t;
		}

		// Load vertices and texture coordinates
		md3_vertex_t * vt = (md3_vertex_t*)(((char*)ss)+LittleLong(ss->Ofs_XYZNormal));
		s->vertices = new MD3Vertex[s->numVertices * numFrames];

		for(int i=0;i<s->numVertices * numFrames;i++)
		{
			s->vertices[i].x = LittleShort(vt[i].x)/64.f;
			s->vertices[i].y = LittleShort(vt[i].y)/64.f;
			s->vertices[i].z = LittleShort(vt[i].z)/64.f;
			UnpackVector( LittleShort(vt[i].n), s->vertices[i].nx, s->vertices[i].ny, s->vertices[i].nz);
		}
	}
}